

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O0

string * amrex::toLower(string *s)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  string *in_RSI;
  string *in_RDI;
  
  uVar1 = std::__cxx11::string::begin();
  uVar2 = std::__cxx11::string::end();
  uVar3 = std::__cxx11::string::begin();
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,amrex::toLower(std::__cxx11::string)::__0>
            (uVar1,uVar2,uVar3);
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

std::string
amrex::toLower (std::string s)
{
    std::transform(s.begin(), s.end(), s.begin(),
                   [](unsigned char c) { return std::tolower(c); });
    return s;
}